

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O2

RefToken antlr::CommonToken::factory(void)

{
  CommonToken *this;
  Token *pTVar1;
  TokenRef *in_RDI;
  
  this = (CommonToken *)operator_new(0x40);
  CommonToken(this);
  pTVar1 = (Token *)TokenRef::getRef((Token *)this);
  in_RDI->ptr = pTVar1;
  return (RefToken)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}